

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O3

float wabt::interp::FloatMin<float>(float lhs,float rhs)

{
  if (NAN(lhs) || NAN(rhs)) {
    return NAN;
  }
  if ((((lhs != 0.0) || (NAN(lhs))) || (rhs != 0.0)) || (NAN(rhs))) {
    if (lhs <= rhs) {
      rhs = lhs;
    }
  }
  else if ((int)lhs < 0) {
    return lhs;
  }
  return rhs;
}

Assistant:

T WABT_VECTORCALL FloatMin(T lhs, T rhs) {
  if (WABT_UNLIKELY(std::isnan(lhs) || std::isnan(rhs))) {
    return std::numeric_limits<T>::quiet_NaN();
  } else if (WABT_UNLIKELY(lhs == 0 && rhs == 0)) {
    return std::signbit(lhs) ? lhs : rhs;
  } else {
    return std::min(lhs, rhs);
  }
}